

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.cc
# Opt level: O3

vector<int,_std::allocator<int>_> *
read_numbered_sentence
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,string *line,Dict *sd,
          vector<int,_std::allocator<int>_> *identifiers)

{
  iterator iVar1;
  pointer piVar2;
  _Alloc_hider __nptr;
  int iVar3;
  istream *piVar4;
  long lVar5;
  string word;
  string sep;
  istringstream in;
  int local_1f4;
  string local_1f0;
  undefined1 *local_1d0;
  size_t local_1c8;
  undefined1 local_1c0 [16];
  long local_1b0 [4];
  byte abStack_190 [88];
  ios_base local_138 [264];
  
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)line,_S_in);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f0._M_string_length = 0;
  local_1f0.field_2._M_local_buf[0] = '\0';
  local_1d0 = local_1c0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"|||","");
  lVar5 = *(long *)(local_1b0[0] + -0x18);
  if ((abStack_190[lVar5] & 5) == 0) {
    piVar2 = (identifiers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((identifiers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
        ._M_finish != piVar2) {
      (identifiers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = piVar2;
    }
    while( true ) {
      piVar4 = std::operator>>((istream *)local_1b0,(string *)&local_1f0);
      __nptr._M_p = local_1f0._M_dataplus._M_p;
      lVar5 = *(long *)(local_1b0[0] + -0x18);
      if (((((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) ||
          ((abStack_190[lVar5] & 5) != 0)) || (local_1f0._M_string_length == 0)) break;
      if (local_1f0._M_string_length == local_1c8) {
        iVar3 = bcmp(local_1f0._M_dataplus._M_p,local_1d0,local_1f0._M_string_length);
        if (iVar3 == 0) break;
      }
      local_1f4 = atoi(__nptr._M_p);
      iVar1._M_current =
           (identifiers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (identifiers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(identifiers,iVar1,&local_1f4)
        ;
      }
      else {
        *iVar1._M_current = local_1f4;
        (identifiers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
        ._M_finish = iVar1._M_current + 1;
      }
    }
  }
  if ((abStack_190[lVar5] & 5) == 0) {
    do {
      std::operator>>((istream *)local_1b0,(string *)&local_1f0);
      if (((abStack_190[*(long *)(local_1b0[0] + -0x18)] & 5) != 0) ||
         (local_1f0._M_string_length == 0)) break;
      local_1f4 = dynet::Dict::convert(sd,&local_1f0);
      iVar1._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (__return_storage_ptr__,iVar1,&local_1f4);
      }
      else {
        *iVar1._M_current = local_1f4;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
    } while ((abStack_190[*(long *)(local_1b0[0] + -0x18)] & 5) == 0);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> read_numbered_sentence(const std::string& line, Dict* sd, vector<int> &identifiers) {
    std::istringstream in(line);
    std::string word;
    std::vector<int> res;
    std::string sep = "|||";
    if (in) {
        identifiers.clear();
        while (in >> word) {
            if (!in || word.empty()) break;
            if (word == sep) break;
            identifiers.push_back(atoi(word.c_str()));
        }
    }

    while(in) {
        in >> word;
        if (!in || word.empty()) break;
        res.push_back(sd->convert(word));
    }
    return res;
}